

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  int iVar1;
  int local_84;
  ImGuiTabItem *local_80;
  ImGuiTabItem *local_78;
  int move_count;
  ImGuiTabItem *dst_tab;
  ImGuiTabItem *src_tab;
  ImGuiTabItem item_tmp;
  ImGuiTabItem *tab2;
  int tab2_order;
  ImGuiTabItem *tab1;
  ImGuiTabBar *tab_bar_local;
  
  local_80 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
  if ((local_80 == (ImGuiTabItem *)0x0) || ((local_80->Flags & 0x20U) != 0)) {
    tab_bar_local._7_1_ = false;
  }
  else {
    iVar1 = ImGuiTabBar::GetTabOrder(tab_bar,local_80);
    iVar1 = iVar1 + tab_bar->ReorderRequestOffset;
    if ((iVar1 < 0) || ((tab_bar->Tabs).Size <= iVar1)) {
      tab_bar_local._7_1_ = false;
    }
    else {
      item_tmp._32_8_ = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar1);
      if ((((ImGuiTabItem *)item_tmp._32_8_)->Flags & 0x20U) == 0) {
        if ((local_80->Flags & 0xc0U) == (((ImGuiTabItem *)item_tmp._32_8_)->Flags & 0xc0U)) {
          memcpy(&src_tab,local_80,0x28);
          if (tab_bar->ReorderRequestOffset < 1) {
            local_78 = (ImGuiTabItem *)item_tmp._32_8_;
          }
          else {
            local_78 = local_80 + 1;
          }
          if (tab_bar->ReorderRequestOffset < 1) {
            local_80 = (ImGuiTabItem *)(item_tmp._32_8_ + 0x28);
          }
          if (tab_bar->ReorderRequestOffset < 1) {
            local_84 = -(int)tab_bar->ReorderRequestOffset;
          }
          else {
            local_84 = (int)tab_bar->ReorderRequestOffset;
          }
          memmove(local_80,local_78,(long)local_84 * 0x28);
          memcpy((void *)item_tmp._32_8_,&src_tab,0x25);
          if ((tab_bar->Flags & 0x400000U) != 0) {
            MarkIniSettingsDirty();
          }
          tab_bar_local._7_1_ = true;
        }
        else {
          tab_bar_local._7_1_ = false;
        }
      }
      else {
        tab_bar_local._7_1_ = false;
      }
    }
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}